

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

QString * QBenchmarkValgrindUtils::outFileBase(QString *__return_storage_ptr__,qint64 pid)

{
  storage_type *psVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("callgrind.out.%1",0x11);
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&QStack_38;
  QString::fromLatin1(QVar2);
  if (pid == -1) {
    pid = QCoreApplication::applicationPid();
  }
  QString::arg_impl((longlong)__return_storage_ptr__,(int)&QStack_38,(int)pid,(QChar)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QBenchmarkValgrindUtils::outFileBase(qint64 pid)
{
    return QString::fromLatin1("callgrind.out.%1").arg(
        pid != -1 ? pid : QCoreApplication::applicationPid());
}